

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O0

bool __thiscall NJamSpell::TSpellCorrector::LoadLangModel(TSpellCorrector *this,string *modelFile)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [8];
  string cacheFile;
  string *modelFile_local;
  TSpellCorrector *this_local;
  
  bVar1 = TLangModel::Load(&this->LangModel,modelFile);
  if (bVar1) {
    std::operator+(local_40,(char *)modelFile);
    bVar1 = LoadCache(this,local_40);
    if (!bVar1) {
      PrepareCache(this);
      SaveCache(this,local_40);
    }
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TSpellCorrector::LoadLangModel(const std::string& modelFile) {
    if (!LangModel.Load(modelFile)) {
        return false;
    }
    std::string cacheFile = modelFile + ".spell";
    if (!LoadCache(cacheFile)) {
        PrepareCache();
        SaveCache(cacheFile);
    }
    return true;
}